

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
ctemplate::BaseArena::GetMemoryWithHandle(BaseArena *this,size_t size,Handle *handle)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  AllocatedBlock *pAVar5;
  void *extraout_RAX;
  void *pvVar6;
  uint uVar7;
  char *in_RCX;
  char *__n;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  BaseArena *this_00;
  int iVar11;
  int iVar12;
  
  if (handle == (Handle *)0x0) {
    GetMemoryWithHandle();
    this_00 = this;
LAB_0012f696:
    GetMemoryWithHandle();
  }
  else {
    this_00 = this;
    pcVar4 = (char *)GetMemory(this,size,1 << ((byte)this->handle_alignment_bits_ & 0x1f));
    pvVar1 = this->overflow_blocks_;
    if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                   *)0x0) {
      in_RCX = (char *)0x0;
    }
    else {
      in_RCX = (char *)((ulong)((long)(pvVar1->
                                      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar1->
                                     super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    iVar11 = (int)in_RCX + this->blocks_alloced_;
    bVar3 = 0 < iVar11;
    if (iVar11 < 1) {
      uVar9 = ((int)in_RCX + this->blocks_alloced_) - 1;
      pAVar5 = (AllocatedBlock *)0x0;
    }
    else {
      do {
        uVar9 = iVar11 - 1;
        size = (size_t)uVar9;
        this_00 = this;
        pAVar5 = IndexToBlock(this,uVar9);
        if ((pAVar5->mem <= pcVar4) && (in_RCX = pAVar5->mem + pAVar5->size, pcVar4 < in_RCX))
        goto LAB_0012f645;
        in_RCX = (char *)(ulong)(iVar11 - 1U);
        bVar3 = 0 < (int)(iVar11 - 1U);
        iVar12 = iVar11 + -1;
        bVar2 = 0 < iVar11;
        iVar11 = iVar12;
      } while (iVar12 != 0 && bVar2);
      uVar9 = 0xffffffff;
    }
LAB_0012f645:
    if (!bVar3) goto LAB_0012f696;
    if (pAVar5 != (AllocatedBlock *)0x0) {
      uVar10 = (ulong)(pcVar4 + (((ulong)uVar9 << ((byte)this->block_size_bits_ & 0x3f)) -
                                (long)pAVar5->mem)) >> ((byte)this->handle_alignment_bits_ & 0x3f);
      if (0xfffffffe < uVar10) {
        uVar10 = 0xffffffff;
      }
      *(int *)handle = (int)uVar10;
      return pcVar4;
    }
  }
  GetMemoryWithHandle();
  uVar9 = (uint)size;
  if (((int)uVar9 < 1) || ((uVar9 + 0x7fffffff & uVar9) != 0)) {
    set_handle_alignment();
LAB_0012f718:
    set_handle_alignment();
  }
  else {
    in_RCX = (char *)(size & 0xffffffff);
    if (in_RCX < (char *)this_00->block_size_) {
      if ((ulong)this_00->block_size_ % (ulong)in_RCX != 0) goto LAB_0012f722;
      if (this_00->freestart_ == this_00->freestart_when_empty_) {
        pvVar1 = this_00->overflow_blocks_;
        if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                       *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = (int)((ulong)((long)(pvVar1->
                                       super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar1->
                                      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        uVar7 = iVar11 + this_00->blocks_alloced_;
        in_RCX = (char *)(ulong)uVar7;
        if (uVar7 == 1) {
          this_00->handle_alignment_ = uVar9;
          iVar11 = -1;
          do {
            iVar11 = iVar11 + 1;
          } while (1 << ((byte)iVar11 & 0x1f) < (int)uVar9);
          this_00->handle_alignment_bits_ = iVar11;
          return extraout_RAX;
        }
      }
      goto LAB_0012f718;
    }
  }
  set_handle_alignment();
LAB_0012f722:
  set_handle_alignment();
  if ((ulong)*(uint *)size == 0xffffffff) {
    HandleToPointer();
  }
  else {
    uVar8 = (ulong)*(uint *)size << ((byte)this_00->handle_alignment_bits_ & 0x3f);
    uVar10 = this_00->block_size_bits_;
    in_RCX = (char *)(uVar10 & 0xffffffff);
    size = uVar8 >> ((byte)in_RCX & 0x3f);
    pAVar5 = IndexToBlock(this_00,(int)size);
    if (pAVar5 != (AllocatedBlock *)0x0) {
      return pAVar5->mem + ((uint)uVar8 & ~(-1 << ((byte)uVar10 & 0x1f)));
    }
  }
  HandleToPointer();
  bVar3 = AdjustLastAlloc(this_00,(void *)size,(size_t)in_RCX);
  if ((__n < in_RCX) && (!bVar3)) {
    pvVar6 = GetMemory(this_00,(size_t)in_RCX,1);
    pvVar6 = memcpy(pvVar6,(void *)size,(size_t)__n);
    return pvVar6;
  }
  return (uint *)size;
}

Assistant:

void* BaseArena::GetMemoryWithHandle(
    const size_t size, BaseArena::Handle* handle) {
  CHECK(handle != NULL);
  // For efficiency, handles are always allocated aligned to a power of 2.
  void* p = GetMemory(size, (1 << handle_alignment_bits_));
  // Find the index of the block the memory was allocated from. In most
  // cases, this will be the last block, so the following loop will
  // iterate exactly once.
  int block_index;
  const AllocatedBlock* block = NULL;
  for (block_index = block_count() - 1; block_index >= 0; --block_index) {
    block = IndexToBlock(block_index);
    if ((p >= block->mem) && (p < (block->mem + block->size))) {
      break;
    }
  }
  CHECK_GE(block_index, 0) << "Failed to find block that was allocated from";
  CHECK(block != NULL) << "Failed to find block that was allocated from";
  const uint64 offset = reinterpret_cast<char*>(p) - block->mem;
  DCHECK_LT(offset, block_size_);
  DCHECK((offset & ((1 << handle_alignment_bits_) - 1)) == 0);
  DCHECK((block_size_ & ((1 << handle_alignment_bits_) - 1)) == 0);
  uint64 handle_value =
      ((static_cast<uint64>(block_index) << block_size_bits_) + offset) >>
      handle_alignment_bits_;
  if (handle_value >= static_cast<uint64>(0xFFFFFFFF)) {
    // We ran out of space to be able to return a handle, so return an invalid
    // handle.
    handle_value = Handle::kInvalidValue;
  }
  handle->handle_ = static_cast<uint32>(handle_value);
  return p;
}